

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_group.cpp
# Opt level: O3

size_t __thiscall mpt::item_group::clear(item_group *this,metatype *ref)

{
  item_array<mpt::metatype> *this_00;
  metatype *pmVar1;
  reference<mpt::content<mpt::item<mpt::metatype>_>_> in_RAX;
  content<mpt::item<mpt::metatype>_> *d;
  content<mpt::item<mpt::metatype>_> *pcVar2;
  ulong uVar3;
  item<mpt::metatype> *it;
  content<mpt::item<mpt::metatype>_> *pcVar4;
  reference<mpt::content<mpt::item<mpt::metatype>_>_> rVar5;
  long lVar6;
  content<mpt::item<mpt::metatype>_> *pcVar7;
  size_t sVar8;
  unique_array<mpt::item<mpt::metatype>_> uVar9;
  unique_array<mpt::item<mpt::metatype>_> local_38;
  
  this_00 = &this->_items;
  pcVar2 = (this->_items).super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
  if (ref == (metatype *)0x0) {
    sVar8 = 0;
    if (pcVar2 != (content<mpt::item<mpt::metatype>_> *)0x0) {
      sVar8 = (size_t)(0x1f < (pcVar2->super_buffer)._used);
    }
    local_38._ref._ref =
         (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
         (reference<mpt::content<mpt::item<mpt::metatype>_>_>)in_RAX._ref;
    unique_array<mpt::item<mpt::metatype>_>::unique_array(&local_38,-1);
    uVar9._ref._ref = local_38._ref._ref;
    rVar5._ref = (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
    if (local_38._ref._ref != (reference<mpt::content<mpt::item<mpt::metatype>_>_>)rVar5._ref) {
      if (local_38._ref._ref == (content<mpt::item<mpt::metatype>_> *)0x0) {
        uVar9._ref._ref =
             (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
             (content<mpt::item<mpt::metatype>_> *)0x0;
      }
      else {
        lVar6 = (**(code **)(*(long *)local_38._ref._ref + 0x10))(local_38._ref._ref);
        if (lVar6 == 0) {
          uVar9._ref._ref =
               (reference<mpt::content<mpt::item<mpt::metatype>_>_>)
               (content<mpt::item<mpt::metatype>_> *)0x0;
        }
        rVar5._ref = (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
      }
      if (rVar5._ref != (content<mpt::item<mpt::metatype>_> *)0x0) {
        (*((rVar5._ref)->super_buffer)._vptr_buffer[1])();
      }
      (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref =
           (content<mpt::item<mpt::metatype>_> *)uVar9._ref._ref;
    }
    if (local_38._ref._ref != (content<mpt::item<mpt::metatype>_> *)0x0) {
      (*(((content<mpt::item<mpt::metatype>_> *)local_38._ref._ref)->super_buffer)._vptr_buffer[1])
                (local_38._ref._ref);
    }
  }
  else {
    pcVar4 = pcVar2 + 1;
    if (pcVar2 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      pcVar7 = (content<mpt::item<mpt::metatype>_> *)0x0;
      pcVar4 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
    else {
      pcVar7 = (content<mpt::item<mpt::metatype>_> *)
               ((long)&(pcVar4->super_buffer)._vptr_buffer +
               ((pcVar2->super_buffer)._used & 0xffffffffffffffe0));
    }
    if (pcVar4 == pcVar7) {
      lVar6 = 0;
      sVar8 = 0;
    }
    else {
      sVar8 = 0;
      lVar6 = 0;
      do {
        pmVar1 = (metatype *)(pcVar4->super_buffer)._vptr_buffer;
        if (pmVar1 == (metatype *)0x0) {
          lVar6 = lVar6 + 1;
        }
        else if (pmVar1 == ref) {
          (*(pmVar1->super_convertable)._vptr_convertable[1])();
          (pcVar4->super_buffer)._vptr_buffer = (_func_int **)0x0;
          sVar8 = sVar8 + 1;
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != pcVar7);
      pcVar2 = (this_00->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
    }
    if (pcVar2 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (pcVar2->super_buffer)._used >> 6;
    }
    if ((long)uVar3 < (long)(lVar6 + sVar8)) {
      item_array<mpt::metatype>::compact(this_00);
    }
  }
  return sVar8;
}

Assistant:

size_t item_group::clear(const metatype *ref)
{
	long remove = 0;
	if (!ref) {
		remove = _items.length();
		_items = item_array<metatype>();
		return remove ? true : false;
	}
	long empty = 0;
	for (auto &it : _items) {
		metatype *curr = it.instance();
		if (!curr) {
			++empty;
			continue;
		}
		if (curr != ref) {
			continue;
		}
		it.set_instance(nullptr);
		++remove;
	}
	if ((remove + empty) > _items.length()/2) {
		_items.compact();
	}
	return remove;
}